

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_arwkv7::llm_build_arwkv7
          (llm_build_arwkv7 *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  ulong uVar4;
  size_t sVar5;
  uint32_t uVar6;
  undefined8 uVar7;
  ggml_tensor *pgVar8;
  ggml_tensor *pgVar9;
  undefined8 uVar10;
  ggml_tensor *pgVar11;
  long lVar12;
  ggml_tensor *gate;
  const_reference pvVar13;
  pointer plVar14;
  void *in_RCX;
  long in_RSI;
  long in_RDI;
  ggml_backend_buffer *name;
  ggml_tensor *in_stack_00000038;
  ggml_tensor *in_stack_00000040;
  ggml_tensor *in_stack_00000048;
  ggml_tensor *in_stack_00000050;
  ggml_cgraph *in_stack_00000058;
  llm_build_rwkv7_base *in_stack_00000060;
  ggml_tensor **in_stack_00000070;
  llama_ubatch *in_stack_00000078;
  int in_stack_00000080;
  ggml_tensor *inp_out_ids;
  ggml_tensor *ffn_inp;
  ggml_tensor *x_prev;
  ggml_tensor *att_norm;
  ggml_tensor *token_shift;
  llama_layer *layer;
  int il;
  uint32_t n_seqs;
  uint32_t n_seq_tokens;
  uint32_t n_embd;
  ggml_tensor *state_mask;
  ggml_tensor *state_copy;
  ggml_tensor *v_first;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  ggml_tensor *in_stack_fffffffffffffda8;
  int iVar15;
  llm_graph_context *in_stack_fffffffffffffdb0;
  llama_model *in_stack_fffffffffffffdb8;
  undefined4 uVar16;
  ggml_tensor *cur_00;
  ggml_tensor *in_stack_fffffffffffffdc0;
  ggml_tensor *in_stack_fffffffffffffdc8;
  llm_graph_context *in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdf8;
  llm_graph_context *in_stack_fffffffffffffe00;
  ggml_tensor *in_stack_fffffffffffffe08;
  ggml_tensor *in_stack_fffffffffffffe10;
  ggml_tensor *in_stack_fffffffffffffe18;
  llm_graph_context *in_stack_fffffffffffffe20;
  ggml_tensor *in_stack_fffffffffffffe48;
  ggml_tensor *in_stack_fffffffffffffe60;
  ggml_tensor *in_stack_fffffffffffffe68;
  ggml_tensor *in_stack_fffffffffffffe70;
  ggml_tensor *in_stack_fffffffffffffe78;
  ggml_tensor *in_stack_fffffffffffffe80;
  ggml_tensor *in_stack_fffffffffffffe88;
  ggml_tensor *in_stack_fffffffffffffe90;
  llm_ffn_gate_type type_gate;
  int il_00;
  void *pvVar17;
  ggml_tensor *in_stack_fffffffffffffeb8;
  undefined8 uVar18;
  llm_graph_context *in_stack_fffffffffffffec0;
  ggml_tensor *local_90;
  int local_68;
  ggml_tensor *local_40;
  
  llm_build_rwkv7_base::llm_build_rwkv7_base
            ((llm_build_rwkv7_base *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (llm_graph_params *)in_stack_fffffffffffffdb0);
  uVar4 = *(ulong *)(in_RDI + 0x20);
  uVar6 = llama_hparams::n_embd_k_s(*(llama_hparams **)(in_RDI + 8));
  if (uVar4 != uVar6) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x2efe,"GGML_ASSERT(%s) failed","n_embd == hparams.n_embd_k_s()");
  }
  local_40 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  llm_graph_context::build_inp_s_copy((llm_graph_context *)in_stack_fffffffffffffe10);
  llm_graph_context::build_inp_s_mask((llm_graph_context *)in_stack_fffffffffffffe10);
  iVar1 = *(int *)(*(long *)(in_RDI + 8) + 8);
  iVar2 = *(int *)(*(long *)(in_RDI + 0x18) + 8);
  uVar3 = *(undefined4 *)(*(long *)(in_RDI + 0x18) + 0xc);
  for (local_68 = 0; iVar15 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
      (long)local_68 < *(long *)(in_RDI + 0x28); local_68 = local_68 + 1) {
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_68
              );
    uVar7 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),local_40,iVar1,iVar2,uVar3);
    pgVar8 = llm_graph_context::build_rwkv_token_shift_load
                       (in_stack_fffffffffffffe20,(ggml_cgraph *)in_stack_fffffffffffffe18,
                        in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                        (llama_ubatch *)in_stack_fffffffffffffe00,SUB84(in_stack_fffffffffffffdf8,4)
                       );
    pgVar9 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                        in_stack_fffffffffffffdc0,(ggml_tensor *)in_stack_fffffffffffffdb8,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                        (int)in_stack_fffffffffffffdb0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,
               (ggml_tensor *)in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0,iVar15);
    uVar16 = (undefined4)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
    uVar18 = *(undefined8 *)(in_RDI + 0xc0);
    uVar10 = ggml_view_3d(uVar18,pgVar9,iVar1,iVar2 + -1,uVar3,pgVar9->nb[1]);
    ggml_concat(uVar18,pgVar8,uVar10,1);
    cur_00 = (ggml_tensor *)CONCAT44(uVar16,local_68);
    pgVar11 = llm_build_rwkv7_base::build_rwkv7_time_mix
                        (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,
                         in_stack_00000040,in_stack_00000038,in_stack_00000070,in_stack_00000078,
                         in_stack_00000080);
    uVar18 = *(undefined8 *)(in_RDI + 0xc0);
    sVar5 = pgVar9->nb[1];
    iVar15 = (int)(pgVar9->nb[2] >> 0x20);
    lVar12 = ggml_element_size();
    name = (ggml_backend_buffer *)((ulong)(uint)((iVar2 + -1) * iVar1) * lVar12);
    ggml_view_3d(uVar18,pgVar9,iVar1,1,uVar3,sVar5);
    pvVar17 = in_RCX;
    pgVar8 = llm_graph_context::build_rwkv_token_shift_store
                       ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                        (llama_ubatch *)in_stack_fffffffffffffe00,SUB84(in_stack_fffffffffffffdf8,4)
                       );
    ggml_build_forward_expand(pvVar17,pgVar8);
    il_00 = (int)pvVar17;
    local_90 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar11,uVar7);
    pgVar8 = local_90;
    llm_graph_context::cb((llm_graph_context *)in_stack_fffffffffffffdc0,cur_00,(char *)name,iVar15)
    ;
    type_gate = (llm_ffn_gate_type)pgVar8;
    if ((long)local_68 == *(long *)(in_RDI + 0x28) + -1) {
      pgVar8 = llm_graph_context::build_inp_out_ids(in_stack_fffffffffffffe00);
      in_stack_fffffffffffffe80 = *(ggml_tensor **)(in_RDI + 0xc0);
      in_stack_fffffffffffffe90 = pgVar8;
      in_stack_fffffffffffffe88 =
           (ggml_tensor *)
           ggml_reshape_2d(in_stack_fffffffffffffe80,pgVar11,iVar1,(long)*(int *)(in_RDI + 0xa8));
      in_stack_fffffffffffffe78 =
           (ggml_tensor *)ggml_get_rows(in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,pgVar8);
      in_stack_fffffffffffffe68 = *(ggml_tensor **)(in_RDI + 0xc0);
      in_stack_fffffffffffffe70 =
           (ggml_tensor *)
           ggml_reshape_2d(in_stack_fffffffffffffe68,local_90,iVar1,(long)*(int *)(in_RDI + 0xa8));
      in_stack_fffffffffffffe60 =
           (ggml_tensor *)ggml_get_rows(in_stack_fffffffffffffe68,in_stack_fffffffffffffe70,pgVar8);
      local_90 = in_stack_fffffffffffffe60;
    }
    pgVar11 = local_90;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_68
              );
    gate = llm_graph_context::build_norm
                     (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                      cur_00,(llm_norm_type)((ulong)name >> 0x20),(int)name);
    llm_graph_context::cb((llm_graph_context *)in_stack_fffffffffffffdc0,cur_00,(char *)name,iVar15)
    ;
    pvVar13 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                         (long)local_68);
    pgVar8 = pvVar13->ffn_up;
    pvVar13 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                         (long)local_68);
    pgVar9 = pvVar13->ffn_gate;
    pvVar13 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                         (long)local_68);
    in_stack_fffffffffffffdb8 = (llama_model *)pvVar13->ffn_down;
    in_stack_fffffffffffffdd0 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffdc8 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffdc0 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffdb0 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffda8 = (ggml_tensor *)0x0;
    pgVar8 = llm_graph_context::build_ffn
                       ((llm_graph_context *)pgVar11,in_stack_fffffffffffffe48,
                        (ggml_tensor *)&stack0xfffffffffffffda8,pgVar9,pgVar8,gate,
                        in_stack_fffffffffffffe60,in_stack_fffffffffffffe68,
                        in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,
                        in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,
                        (llm_ffn_op_type)in_stack_fffffffffffffe90,type_gate,il_00);
    in_stack_fffffffffffffe48 = pgVar8;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,
               (ggml_tensor *)in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0,
               (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
    in_stack_fffffffffffffe20 =
         (llm_graph_context *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar8,local_90);
    local_40 = llm_graph_context::build_cvec(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,0);
    in_stack_fffffffffffffe18 = local_40;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffdc0,
               (ggml_tensor *)in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0,
               (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
  }
  pgVar9 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                      (ggml_tensor *)in_stack_fffffffffffffdb8,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                      (int)in_stack_fffffffffffffdb0);
  pgVar8 = pgVar9;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffdc0,(ggml_tensor *)in_stack_fffffffffffffdb8
             ,(char *)in_stack_fffffffffffffdb0,iVar15);
  plVar14 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4fdfd6);
  plVar14->t_embd = pgVar9;
  pgVar9 = llm_graph_context::build_lora_mm
                     ((llm_graph_context *)pgVar8,in_stack_fffffffffffffe08,pgVar9);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffdc0,(ggml_tensor *)in_stack_fffffffffffffdb8
             ,(char *)in_stack_fffffffffffffdb0,iVar15);
  pgVar8 = pgVar9;
  plVar14 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4fe05b);
  plVar14->t_logits = pgVar8;
  ggml_build_forward_expand(in_RCX,pgVar9);
  return;
}

Assistant:

llm_build_arwkv7(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_build_rwkv7_base(model, params) {
        GGML_ASSERT(n_embd == hparams.n_embd_k_s());

        ggml_tensor * cur;
        ggml_tensor * inpL;
        ggml_tensor * v_first = nullptr;

        inpL = build_inp_embd(model.tok_embd);

        ggml_tensor * state_copy = build_inp_s_copy();
        ggml_tensor * state_mask = build_inp_s_mask();

        const auto n_embd = hparams.n_embd;
        const auto n_seq_tokens = ubatch.n_seq_tokens;
        const auto n_seqs = ubatch.n_seqs;

        for (int il = 0; il < n_layer; ++il) {
            const llama_layer * layer = &model.layers[il];
            inpL = ggml_reshape_3d(ctx0, inpL, n_embd, n_seq_tokens, n_seqs);

            ggml_tensor * token_shift = build_rwkv_token_shift_load(
                    gf, state_copy, state_mask, ubatch, il
                    );

            ggml_tensor * att_norm = build_norm(inpL, layer->attn_norm, layer->attn_norm_b, LLM_NORM_RMS, il);
            cb(att_norm, "attn_norm", il);

            ggml_tensor * x_prev = ggml_concat(
                    ctx0,
                    token_shift,
                    ggml_view_3d(ctx0, att_norm, n_embd, n_seq_tokens - 1, n_seqs, att_norm->nb[1], att_norm->nb[2], 0),
                    1
                    );

            cur = build_rwkv7_time_mix(gf, att_norm, x_prev, state_copy, state_mask, v_first, ubatch, il);

            token_shift = ggml_view_3d(ctx0, att_norm, n_embd, 1, n_seqs, att_norm->nb[1], att_norm->nb[2], (n_seq_tokens-1)*n_embd*ggml_element_size(att_norm));
            ggml_build_forward_expand(gf, build_rwkv_token_shift_store(token_shift, ubatch, il));

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpL);
            cb(ffn_inp, "ffn_inp", il);

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                struct ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur     = ggml_get_rows(ctx0, ggml_reshape_2d(ctx0, cur, n_embd, n_tokens), inp_out_ids);
                ffn_inp = ggml_get_rows(ctx0, ggml_reshape_2d(ctx0, ffn_inp, n_embd, n_tokens), inp_out_ids);
            }

            // feed-forward network
            cur = build_norm(ffn_inp,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            cur = build_ffn(cur,
                    model.layers[il].ffn_up,   NULL, NULL,
                    model.layers[il].ffn_gate, NULL, NULL,
                    model.layers[il].ffn_down, NULL, NULL,
                    NULL,
                    LLM_FFN_SILU, LLM_FFN_PAR, il);
            cb(cur, "ffn_out", il);

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;
        cur = build_norm(cur, model.output_norm, model.output_norm_b, LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }